

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void SortByDimension(Rtree *pRtree,int *aIdx,int nIdx,int iDim,RtreeCell *aCell,int *aSpare)

{
  int *aIdx_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  u8 uVar5;
  int iVar6;
  int iVar7;
  int nIdx_00;
  uint uVar8;
  int iVar9;
  uint nIdx_01;
  
  if (1 < nIdx) {
    nIdx_01 = (uint)nIdx >> 1;
    nIdx_00 = nIdx - nIdx_01;
    aIdx_00 = aIdx + nIdx_01;
    SortByDimension(pRtree,aIdx,nIdx_01,iDim,aCell,aSpare);
    SortByDimension(pRtree,aIdx_00,nIdx_00,iDim,aCell,aSpare);
    memcpy(aSpare,aIdx,(ulong)nIdx_01 * 4);
    uVar5 = pRtree->eCoordType;
    iVar6 = iDim * 2;
    iVar7 = iDim * 2 + 1;
    uVar8 = 0;
    iVar9 = 0;
    do {
      if (uVar5 == '\0') {
        fVar1 = aCell[aSpare[(int)uVar8]].aCoord[iVar6].f;
      }
      else {
        fVar1 = (float)aCell[aSpare[(int)uVar8]].aCoord[iVar6].i;
      }
      if (uVar5 == '\0') {
        fVar2 = aCell[aSpare[(int)uVar8]].aCoord[iVar7].f;
      }
      else {
        fVar2 = (float)aCell[aSpare[(int)uVar8]].aCoord[iVar7].i;
      }
      if (uVar5 == '\0') {
        fVar3 = aCell[aIdx_00[iVar9]].aCoord[iVar6].f;
      }
      else {
        fVar3 = (float)aCell[aIdx_00[iVar9]].aCoord[iVar6].i;
      }
      if (uVar5 == '\0') {
        fVar4 = aCell[aIdx_00[iVar9]].aCoord[iVar7].f;
      }
      else {
        fVar4 = (float)aCell[aIdx_00[iVar9]].aCoord[iVar7].i;
      }
      if ((uVar8 == nIdx_01) ||
         (((iVar9 != nIdx_00 && (fVar3 <= fVar1)) &&
          ((fVar1 != fVar3 || ((NAN(fVar1) || NAN(fVar3) || (fVar4 <= fVar2)))))))) {
        aIdx[(int)(uVar8 + iVar9)] = aIdx_00[iVar9];
        iVar9 = iVar9 + 1;
      }
      else {
        aIdx[(int)(uVar8 + iVar9)] = aSpare[(int)uVar8];
        uVar8 = uVar8 + 1;
      }
    } while (iVar9 < nIdx_00 || (int)uVar8 < (int)nIdx_01);
  }
  return;
}

Assistant:

static void SortByDimension(
  Rtree *pRtree,
  int *aIdx, 
  int nIdx, 
  int iDim, 
  RtreeCell *aCell, 
  int *aSpare
){
  if( nIdx>1 ){

    int iLeft = 0;
    int iRight = 0;

    int nLeft = nIdx/2;
    int nRight = nIdx-nLeft;
    int *aLeft = aIdx;
    int *aRight = &aIdx[nLeft];

    SortByDimension(pRtree, aLeft, nLeft, iDim, aCell, aSpare);
    SortByDimension(pRtree, aRight, nRight, iDim, aCell, aSpare);

    memcpy(aSpare, aLeft, sizeof(int)*nLeft);
    aLeft = aSpare;
    while( iLeft<nLeft || iRight<nRight ){
      RtreeDValue xleft1 = DCOORD(aCell[aLeft[iLeft]].aCoord[iDim*2]);
      RtreeDValue xleft2 = DCOORD(aCell[aLeft[iLeft]].aCoord[iDim*2+1]);
      RtreeDValue xright1 = DCOORD(aCell[aRight[iRight]].aCoord[iDim*2]);
      RtreeDValue xright2 = DCOORD(aCell[aRight[iRight]].aCoord[iDim*2+1]);
      if( (iLeft!=nLeft) && ((iRight==nRight)
       || (xleft1<xright1)
       || (xleft1==xright1 && xleft2<xright2)
      )){
        aIdx[iLeft+iRight] = aLeft[iLeft];
        iLeft++;
      }else{
        aIdx[iLeft+iRight] = aRight[iRight];
        iRight++;
      }
    }

#if 0
    /* Check that the sort worked */
    {
      int jj;
      for(jj=1; jj<nIdx; jj++){
        RtreeDValue xleft1 = aCell[aIdx[jj-1]].aCoord[iDim*2];
        RtreeDValue xleft2 = aCell[aIdx[jj-1]].aCoord[iDim*2+1];
        RtreeDValue xright1 = aCell[aIdx[jj]].aCoord[iDim*2];
        RtreeDValue xright2 = aCell[aIdx[jj]].aCoord[iDim*2+1];
        assert( xleft1<=xright1 && (xleft1<xright1 || xleft2<=xright2) );
      }
    }
#endif
  }
}